

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stw_le_m68k
               (uc_struct_conflict3 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  address_space_stw_internal_m68k(uc,as,addr,val,attrs,result,DEVICE_LITTLE_ENDIAN);
  return;
}

Assistant:

void glue(address_space_stw_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stw_internal, SUFFIX)(uc, ARG1, addr, val, attrs, result,
                                             DEVICE_LITTLE_ENDIAN);
}